

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  curl_off_t cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char in_AL;
  int iVar7;
  FormInfo *pFVar8;
  int *piVar9;
  char *pcVar10;
  FormInfo *pFVar11;
  long *plVar12;
  curl_slist *pcVar13;
  undefined8 *puVar14;
  char *pcVar15;
  size_t sVar16;
  curl_httppost *pcVar17;
  curl_httppost *pcVar18;
  uint uVar19;
  undefined8 in_RCX;
  size_t i;
  FormInfo *pFVar20;
  ulong uVar21;
  char **ppcVar22;
  curl_httppost **ppcVar23;
  undefined8 in_RDX;
  size_t sVar24;
  undefined8 in_R8;
  undefined8 in_R9;
  FormInfo *ptr_1;
  int *piVar25;
  CURLFORMcode CVar26;
  FormInfo *ptr;
  curl_slist *pcVar27;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  char *local_150;
  ulong local_148;
  char *local_140;
  long local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  arg[0].overflow_arg_area = &stack0x00000008;
  uVar19 = 0x10;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pFVar8 = (FormInfo *)(*Curl_ccalloc)(1,0x68);
  if (pFVar8 == (FormInfo *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  pcVar27 = (curl_slist *)0x0;
  piVar25 = (int *)0x0;
  CVar26 = CURL_FORMADD_OK;
  pFVar20 = pFVar8;
  bVar3 = false;
switchD_00117a65_caseD_9:
  pFVar11 = pFVar8;
  if (CVar26 == CURL_FORMADD_OK) {
    if ((bool)(piVar25 != (int *)0x0 & bVar3)) goto code_r0x001179f9;
    uVar21 = (ulong)uVar19;
    if (uVar21 < 0x29) {
      uVar19 = uVar19 + 8;
      piVar9 = (int *)((long)local_e8 + uVar21);
    }
    else {
      piVar9 = (int *)arg[0].overflow_arg_area;
      arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
    }
    iVar7 = *piVar9;
    if (iVar7 != 0x11) goto LAB_00117a51;
    CVar26 = CURL_FORMADD_OK;
    pFVar20 = pFVar8;
    pcVar10 = (char *)0x0;
    pcVar18 = (curl_httppost *)0x0;
    goto LAB_00118244;
  }
  for (; pFVar11 != (FormInfo *)0x0; pFVar11 = pFVar11->more) {
    if (pFVar11->name_alloc == true) {
      (*Curl_cfree)(pFVar11->name);
      pFVar11->name = (char *)0x0;
      pFVar11->name_alloc = false;
    }
    if (pFVar11->value_alloc == true) {
      (*Curl_cfree)(pFVar11->value);
      pFVar11->value = (char *)0x0;
      pFVar11->value_alloc = false;
    }
    if (pFVar11->contenttype_alloc == true) {
      (*Curl_cfree)(pFVar11->contenttype);
      pFVar11->contenttype = (char *)0x0;
      pFVar11->contenttype_alloc = false;
    }
    if (pFVar11->showfilename_alloc == true) {
      (*Curl_cfree)(pFVar11->showfilename);
      pFVar11->showfilename = (char *)0x0;
      pFVar11->showfilename_alloc = false;
    }
  }
  goto LAB_001185e0;
code_r0x001179f9:
  iVar7 = *piVar25;
  pcVar27 = *(curl_slist **)(piVar25 + 2);
  piVar25 = piVar25 + 4;
  CVar26 = CURL_FORMADD_OK;
  bVar3 = false;
  if (iVar7 == 0x11) goto switchD_00117a65_caseD_9;
  bVar3 = true;
LAB_00117a51:
  CVar26 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar13 = pcVar27;
  switch(iVar7) {
  case 2:
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 4;
  case 1:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->name == (char *)0x0) {
      if (!bVar3) {
        uVar21 = (ulong)uVar19;
        if (uVar21 < 0x29) {
          uVar19 = uVar19 + 8;
          plVar12 = (long *)((long)local_e8 + uVar21);
        }
        else {
          plVar12 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar13 = (curl_slist *)*plVar12;
      }
      CVar26 = CURL_FORMADD_NULL;
      if (pcVar13 != (curl_slist *)0x0) {
        pFVar20->name = (char *)pcVar13;
        CVar26 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00117a65_caseD_9;
  case 3:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->namelength == 0) {
      if (!bVar3) {
        uVar21 = (ulong)uVar19;
        if (uVar21 < 0x29) {
          uVar19 = uVar19 + 8;
          plVar12 = (long *)((long)local_e8 + uVar21);
        }
        else {
          plVar12 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar13 = (curl_slist *)*plVar12;
      }
      pFVar20->namelength = (size_t)pcVar13;
      CVar26 = CURL_FORMADD_OK;
    }
    goto switchD_00117a65_caseD_9;
  case 5:
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 8;
  case 4:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->value != (char *)0x0) goto switchD_00117a65_caseD_9;
    if (!bVar3) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        plVar12 = (long *)((long)local_e8 + uVar21);
      }
      else {
        plVar12 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar13 = (curl_slist *)*plVar12;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar13 == (curl_slist *)0x0) goto switchD_00117a65_caseD_9;
    break;
  case 7:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if ((pFVar20->flags & 10) != 0) goto switchD_00117a65_caseD_9;
    if (!bVar3) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        puVar14 = (undefined8 *)((long)local_e8 + uVar21);
      }
      else {
        puVar14 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar13 = (curl_slist *)*puVar14;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar13 == (curl_slist *)0x0) goto switchD_00117a65_caseD_9;
    pcVar10 = (*Curl_cstrdup)((char *)pcVar13);
    pFVar20->value = pcVar10;
    CVar26 = CURL_FORMADD_MEMORY;
    if (pcVar10 == (char *)0x0) goto switchD_00117a65_caseD_9;
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 2;
    goto LAB_0011817f;
  case 8:
    CVar26 = CURL_FORMADD_ILLEGAL_ARRAY;
    bVar6 = !bVar3;
    bVar3 = true;
    if (bVar6) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        puVar14 = (undefined8 *)((long)local_e8 + uVar21);
      }
      else {
        puVar14 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      piVar25 = (int *)*puVar14;
      bVar3 = piVar25 != (int *)0x0;
      CVar26 = (uint)(piVar25 == (int *)0x0) * 3;
    }
  default:
    goto switchD_00117a65_caseD_9;
  case 10:
    if (!bVar3) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        puVar14 = (undefined8 *)((long)local_e8 + uVar21);
      }
      else {
        puVar14 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar13 = (curl_slist *)*puVar14;
    }
    if (pFVar20->value != (char *)0x0) {
      CVar26 = CURL_FORMADD_OPTION_TWICE;
      if (((pFVar20->flags & 1) == 0) || (CVar26 = CURL_FORMADD_NULL, pcVar13 == (curl_slist *)0x0))
      goto switchD_00117a65_caseD_9;
      pcVar10 = (*Curl_cstrdup)((char *)pcVar13);
      CVar26 = CURL_FORMADD_MEMORY;
      if (pcVar10 == (char *)0x0) goto switchD_00117a65_caseD_9;
      pFVar11 = AddFormInfo(pcVar10,(char *)0x0,pFVar20);
      if (pFVar11 == (FormInfo *)0x0) goto LAB_0011818b;
      pFVar11->value_alloc = true;
      goto LAB_00117f44;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar13 == (curl_slist *)0x0) goto switchD_00117a65_caseD_9;
    pcVar10 = (*Curl_cstrdup)((char *)pcVar13);
    pFVar20->value = pcVar10;
    CVar26 = CURL_FORMADD_MEMORY;
    if (pcVar10 == (char *)0x0) goto switchD_00117a65_caseD_9;
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 1;
LAB_0011817f:
    pFVar20->value_alloc = true;
    CVar26 = CURL_FORMADD_OK;
    goto switchD_00117a65_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar3) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        puVar14 = (undefined8 *)((long)local_e8 + uVar21);
      }
      else {
        puVar14 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar13 = (curl_slist *)*puVar14;
    }
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->showfilename == (char *)0x0) {
      pcVar10 = (*Curl_cstrdup)((char *)pcVar13);
      pFVar20->showfilename = pcVar10;
      CVar26 = CURL_FORMADD_MEMORY;
      if (pcVar10 != (char *)0x0) {
        pFVar20->showfilename_alloc = true;
        CVar26 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00117a65_caseD_9;
  case 0xc:
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 0x30;
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->buffer != (char *)0x0) goto switchD_00117a65_caseD_9;
    if (!bVar3) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        plVar12 = (long *)((long)local_e8 + uVar21);
      }
      else {
        plVar12 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar13 = (curl_slist *)*plVar12;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar13 == (curl_slist *)0x0) goto switchD_00117a65_caseD_9;
    pFVar20->buffer = (char *)pcVar13;
    break;
  case 0xd:
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->bufferlength == 0) {
      if (!bVar3) {
        uVar21 = (ulong)uVar19;
        if (uVar21 < 0x29) {
          uVar19 = uVar19 + 8;
          plVar12 = (long *)((long)local_e8 + uVar21);
        }
        else {
          plVar12 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar13 = (curl_slist *)*plVar12;
      }
      pFVar20->bufferlength = (size_t)pcVar13;
      CVar26 = CURL_FORMADD_OK;
    }
    goto switchD_00117a65_caseD_9;
  case 0xe:
    if (!bVar3) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        puVar14 = (undefined8 *)((long)local_e8 + uVar21);
      }
      else {
        puVar14 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar13 = (curl_slist *)*puVar14;
    }
    if (pFVar20->contenttype == (char *)0x0) {
      CVar26 = CURL_FORMADD_NULL;
      if (pcVar13 != (curl_slist *)0x0) {
        pcVar10 = (*Curl_cstrdup)((char *)pcVar13);
        pFVar20->contenttype = pcVar10;
        CVar26 = CURL_FORMADD_MEMORY;
        if (pcVar10 != (char *)0x0) {
          pFVar20->contenttype_alloc = true;
          CVar26 = CURL_FORMADD_OK;
        }
      }
      goto switchD_00117a65_caseD_9;
    }
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (((pFVar20->flags & 1) == 0) || (CVar26 = CURL_FORMADD_NULL, pcVar13 == (curl_slist *)0x0))
    goto switchD_00117a65_caseD_9;
    pcVar10 = (*Curl_cstrdup)((char *)pcVar13);
    CVar26 = CURL_FORMADD_MEMORY;
    if (pcVar10 == (char *)0x0) goto switchD_00117a65_caseD_9;
    pFVar11 = AddFormInfo((char *)0x0,pcVar10,pFVar20);
    if (pFVar11 == (FormInfo *)0x0) {
LAB_0011818b:
      (*Curl_cfree)(pcVar10);
      CVar26 = CURL_FORMADD_MEMORY;
      goto switchD_00117a65_caseD_9;
    }
    pFVar11->contenttype_alloc = true;
LAB_00117f44:
    CVar26 = CURL_FORMADD_OK;
    pFVar20 = pFVar11;
    goto switchD_00117a65_caseD_9;
  case 0xf:
    if (!bVar3) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        plVar12 = (long *)((long)local_e8 + uVar21);
      }
      else {
        plVar12 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar13 = (curl_slist *)*plVar12;
    }
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->contentheader == (curl_slist *)0x0) {
      pFVar20->contentheader = pcVar13;
      CVar26 = CURL_FORMADD_OK;
    }
    goto switchD_00117a65_caseD_9;
  case 0x13:
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 0x40;
    CVar26 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->userp != (char *)0x0) goto switchD_00117a65_caseD_9;
    if (!bVar3) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        plVar12 = (long *)((long)local_e8 + uVar21);
      }
      else {
        plVar12 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar13 = (curl_slist *)*plVar12;
    }
    CVar26 = CURL_FORMADD_NULL;
    if (pcVar13 == (curl_slist *)0x0) goto switchD_00117a65_caseD_9;
    pFVar20->userp = (char *)pcVar13;
    break;
  case 0x14:
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 0x80;
  case 6:
    if (!bVar3) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        plVar12 = (long *)((long)local_e8 + uVar21);
      }
      else {
        plVar12 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar13 = (curl_slist *)*plVar12;
    }
    pFVar20->contentslength = (curl_off_t)pcVar13;
    CVar26 = CURL_FORMADD_OK;
    goto switchD_00117a65_caseD_9;
  }
  pFVar20->value = (char *)pcVar13;
  CVar26 = CURL_FORMADD_OK;
  goto switchD_00117a65_caseD_9;
LAB_00118244:
  if (pFVar20 != (FormInfo *)0x0) {
    local_140 = pFVar20->name;
    if (local_140 == (char *)0x0) {
      if (pcVar18 == (curl_httppost *)0x0) goto LAB_0011854a;
LAB_0011826e:
      uVar21 = pFVar20->flags;
      if (((((pFVar20->contentslength != 0 & (byte)uVar21) != 0) || (((uint)uVar21 & 9) == 9)) ||
          (uVar19 = ~(uint)uVar21, (uVar19 & 10) == 0)) ||
         ((uVar19 & 0x30) == 0 && pFVar20->buffer == (char *)0x0)) goto LAB_0011854a;
      if (((uVar21 & 0x11) != 0) && (pFVar20->contenttype == (char *)0x0)) {
        ppcVar22 = &pFVar20->showfilename;
        if ((uVar21 & 0x10) == 0) {
          ppcVar22 = &pFVar20->value;
        }
        pcVar15 = Curl_mime_contenttype(*ppcVar22);
        if (pcVar15 == (char *)0x0) {
          pcVar15 = pcVar10;
        }
        if (pcVar15 == (char *)0x0) {
          pcVar15 = "application/octet-stream";
        }
        pcVar15 = (*Curl_cstrdup)(pcVar15);
        pFVar20->contenttype = pcVar15;
        if (pcVar15 != (char *)0x0) {
          pFVar20->contenttype_alloc = true;
          local_140 = pFVar20->name;
          goto LAB_00118316;
        }
LAB_00118550:
        CVar26 = CURL_FORMADD_MEMORY;
        goto LAB_001185c9;
      }
LAB_00118316:
      if ((local_140 != (char *)0x0) && (pFVar20->namelength != 0)) {
        sVar24 = 0;
        while (pFVar20->namelength != sVar24) {
          pcVar15 = local_140 + sVar24;
          sVar24 = sVar24 + 1;
          if (*pcVar15 == '\0') {
            CVar26 = CURL_FORMADD_NULL;
            goto LAB_001185c9;
          }
        }
      }
      local_148 = pFVar20->flags;
      if (pFVar20 == pFVar8 && (local_148 & 4) == 0) {
        if (local_140 != (char *)0x0) {
          sVar24 = pFVar20->namelength;
          if (sVar24 == 0) {
            sVar16 = strlen(local_140);
            sVar24 = sVar16 + 1;
          }
          local_140 = (char *)Curl_memdup(local_140,sVar24);
          pFVar20->name = local_140;
          if (local_140 != (char *)0x0) {
            pFVar20->name_alloc = true;
            local_148 = pFVar20->flags;
            goto LAB_00118394;
          }
        }
        goto LAB_00118550;
      }
LAB_00118394:
      local_150 = pFVar20->value;
      if ((local_148 & 0x6b) == 0) {
        if (local_150 == (char *)0x0) {
          local_150 = (char *)0x0;
        }
        else {
          sVar24 = pFVar20->contentslength;
          if (sVar24 == 0) {
            sVar16 = strlen(local_150);
            sVar24 = sVar16 + 1;
          }
          local_150 = (char *)Curl_memdup(local_150,sVar24);
          pFVar20->value = local_150;
          if (local_150 == (char *)0x0) goto LAB_00118550;
          pFVar20->value_alloc = true;
          local_140 = pFVar20->name;
          local_148 = pFVar20->flags;
        }
      }
      sVar16 = pFVar20->namelength;
      cVar1 = pFVar20->contentslength;
      pcVar15 = pFVar20->buffer;
      sVar24 = pFVar20->bufferlength;
      pcVar2 = pFVar20->contenttype;
      pcVar27 = pFVar20->contentheader;
      pcVar4 = pFVar20->showfilename;
      pcVar5 = pFVar20->userp;
      pcVar17 = (curl_httppost *)(*Curl_ccalloc)(1,0x70);
      if (pcVar17 == (curl_httppost *)0x0) goto LAB_00118550;
      pcVar17->name = local_140;
      if (local_140 == (char *)0x0) {
        sVar16 = 0;
      }
      else if (sVar16 == 0) {
        sVar16 = strlen(local_140);
      }
      pcVar17->namelength = sVar16;
      pcVar17->contents = local_150;
      pcVar17->contentlen = cVar1;
      pcVar17->buffer = pcVar15;
      pcVar17->bufferlength = sVar24;
      pcVar17->contenttype = pcVar2;
      pcVar17->contentheader = pcVar27;
      pcVar17->showfilename = pcVar4;
      pcVar17->userp = pcVar5;
      pcVar17->flags = local_148 | 0x80;
      if (pcVar18 == (curl_httppost *)0x0) {
        pcVar18 = *last_post;
        if (*last_post == (curl_httppost *)0x0) {
          pcVar18 = (curl_httppost *)httppost;
        }
        pcVar18->next = pcVar17;
        ppcVar23 = last_post;
      }
      else {
        pcVar17->more = pcVar18->more;
        ppcVar23 = &pcVar18->more;
      }
      *ppcVar23 = pcVar17;
      ppcVar22 = &pFVar20->contenttype;
      pFVar20 = pFVar20->more;
      pcVar18 = pcVar17;
      if (*ppcVar22 != (char *)0x0) {
        pcVar10 = *ppcVar22;
      }
      goto LAB_00118244;
    }
    if (pFVar20->value != (char *)0x0 || pcVar18 != (curl_httppost *)0x0) goto LAB_0011826e;
LAB_0011854a:
    CVar26 = CURL_FORMADD_INCOMPLETE;
LAB_001185c9:
    for (; pFVar20 != (FormInfo *)0x0; pFVar20 = pFVar20->more) {
      if (pFVar20->name_alloc == true) {
        (*Curl_cfree)(pFVar20->name);
        pFVar20->name = (char *)0x0;
        pFVar20->name_alloc = false;
      }
      if (pFVar20->value_alloc == true) {
        (*Curl_cfree)(pFVar20->value);
        pFVar20->value = (char *)0x0;
        pFVar20->value_alloc = false;
      }
      if (pFVar20->contenttype_alloc == true) {
        (*Curl_cfree)(pFVar20->contenttype);
        pFVar20->contenttype = (char *)0x0;
        pFVar20->contenttype_alloc = false;
      }
      if (pFVar20->showfilename_alloc == true) {
        (*Curl_cfree)(pFVar20->showfilename);
        pFVar20->showfilename = (char *)0x0;
        pFVar20->showfilename_alloc = false;
      }
    }
  }
LAB_001185e0:
  while (pFVar8 != (FormInfo *)0x0) {
    pFVar20 = pFVar8->more;
    (*Curl_cfree)(pFVar8);
    pFVar8 = pFVar20;
  }
  return CVar26;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}